

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int ra_shrink_to_fit(roaring_array_t *ra)

{
  _Bool _Var1;
  int savings;
  roaring_array_t *ra_local;
  
  ra_local._4_4_ = (ra->allocation_size - ra->size) * 0xb;
  _Var1 = realloc_array(ra,ra->size);
  if (_Var1) {
    ra->allocation_size = ra->size;
  }
  else {
    ra_local._4_4_ = 0;
  }
  return ra_local._4_4_;
}

Assistant:

int ra_shrink_to_fit(roaring_array_t *ra) {
    int savings = (ra->allocation_size - ra->size) *
                  (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    if (!realloc_array(ra, ra->size)) {
      return 0;
    }
    ra->allocation_size = ra->size;
    return savings;
}